

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  StkId pTVar1;
  undefined4 uVar2;
  StkId pTVar3;
  TValue *io1;
  int i;
  int n_local;
  lua_State *to_local;
  lua_State *from_local;
  
  if (from != to) {
    from->top = from->top + -(long)n;
    for (io1._0_4_ = 0; (int)io1 < n; io1._0_4_ = (int)io1 + 1) {
      pTVar1 = to->top;
      pTVar3 = from->top + (int)io1;
      pTVar1->value_ = pTVar3->value_;
      uVar2 = *(undefined4 *)&pTVar3->field_0xc;
      pTVar1->tt_ = pTVar3->tt_;
      *(undefined4 *)&pTVar1->field_0xc = uVar2;
      to->top = to->top + 1;
    }
  }
  return;
}

Assistant:

LUA_API void lua_xmove (lua_State *from, lua_State *to, int n) {
  int i;
  if (from == to) return;
  lua_lock(to);
  api_checknelems(from, n);
  api_check(from, G(from) == G(to), "moving among independent states");
  api_check(from, to->ci->top - to->top >= n, "stack overflow");
  from->top -= n;
  for (i = 0; i < n; i++) {
    setobj2s(to, to->top, from->top + i);
    to->top++;  /* stack already checked by previous 'api_check' */
  }
  lua_unlock(to);
}